

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O3

Class * __thiscall r_code::vector<r_comp::Class>::operator[](vector<r_comp::Class> *this,size_t i)

{
  pointer pCVar1;
  ulong uVar2;
  
  pCVar1 = (this->m_vector).super__Vector_base<r_comp::Class,_std::allocator<r_comp::Class>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar2 = ((long)(this->m_vector).super__Vector_base<r_comp::Class,_std::allocator<r_comp::Class>_>.
                 _M_impl.super__Vector_impl_data._M_finish - (long)pCVar1 >> 3) *
          -0x71c71c71c71c71c7;
  if (uVar2 < i || uVar2 - i == 0) {
    std::vector<r_comp::Class,_std::allocator<r_comp::Class>_>::resize(&this->m_vector,i + 1);
    pCVar1 = (this->m_vector).super__Vector_base<r_comp::Class,_std::allocator<r_comp::Class>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar2 = ((long)(this->m_vector).
                   super__Vector_base<r_comp::Class,_std::allocator<r_comp::Class>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)pCVar1 >> 3) * -0x71c71c71c71c71c7;
  }
  if (i < uVar2) {
    return pCVar1 + i;
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",i);
}

Assistant:

T &operator [](size_t i)
    {
        if (i >= size()) {
            m_vector.resize(i + 1);
        }

        return m_vector.at(i);
    }